

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.c
# Opt level: O3

exr_result_t
internal_coding_fill_channel_info
          (exr_coding_channel_info_t **channels,int16_t *num_chans,
          exr_coding_channel_info_t *builtinextras,exr_chunk_info_t *cinfo,
          _internal_exr_context *pctxt,_internal_exr_part *part)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  exr_pixel_type_t eVar6;
  exr_attr_chlist_t *peVar7;
  size_t __n;
  uint uVar8;
  int iVar9;
  exr_result_t eVar10;
  int iVar11;
  int iVar12;
  int32_t *piVar13;
  long lVar14;
  
  peVar7 = (part->channels->field_6).chlist;
  uVar1 = peVar7->num_channels;
  if ((long)(int)uVar1 < 6) {
    if ((int)uVar1 < 1) goto LAB_001230b6;
  }
  else {
    __n = (long)(int)uVar1 * 0x30;
    builtinextras = (exr_coding_channel_info_t *)(*pctxt->alloc_fn)(__n);
    if (builtinextras == (exr_coding_channel_info_t *)0x0) {
      eVar10 = (*pctxt->standard_error)(pctxt,1);
      return eVar10;
    }
    memset(builtinextras,0,__n);
  }
  iVar2 = cinfo->start_y;
  uVar3 = cinfo->height;
  iVar12 = uVar3 + iVar2 + -1;
  iVar4 = cinfo->width;
  piVar13 = &peVar7->entries->y_sampling;
  lVar14 = 0;
  do {
    *(char **)((long)&builtinextras->channel_name + lVar14) = *(char **)(piVar13 + -5);
    iVar5 = *piVar13;
    uVar8 = uVar3;
    if (1 < iVar5) {
      iVar11 = iVar2 % iVar5;
      if (uVar3 == 1) {
        uVar8 = (uint)(iVar11 == 0);
      }
      else {
        iVar9 = iVar5 - iVar11;
        if (iVar11 == 0) {
          iVar9 = 0;
        }
        iVar11 = iVar12 - iVar12 % iVar5;
        uVar8 = 0;
        if (iVar9 + iVar2 <= iVar11) {
          uVar8 = (iVar11 - (iVar9 + iVar2)) / iVar5 + 1;
        }
      }
    }
    *(uint *)((long)&builtinextras->height + lVar14) = uVar8;
    iVar11 = piVar13[-1];
    iVar9 = iVar4;
    if (1 < iVar11) {
      iVar9 = iVar4 / iVar11;
    }
    *(int *)((long)&builtinextras->width + lVar14) = iVar9;
    *(int *)((long)&builtinextras->x_samples + lVar14) = iVar11;
    *(int *)((long)&builtinextras->y_samples + lVar14) = iVar5;
    (&builtinextras->p_linear)[lVar14] = *(uint8_t *)(piVar13 + -2);
    eVar6 = piVar13[-3];
    (&builtinextras->bytes_per_element)[lVar14] = (eVar6 != EXR_PIXEL_HALF) * '\x02' + '\x02';
    *(short *)((long)&builtinextras->data_type + lVar14) = (short)eVar6;
    *(ushort *)((long)&builtinextras->user_bytes_per_element + lVar14) =
         (ushort)(eVar6 != EXR_PIXEL_HALF) * 2 + 2;
    *(short *)((long)&builtinextras->user_data_type + lVar14) = (short)eVar6;
    lVar14 = lVar14 + 0x30;
    piVar13 = piVar13 + 8;
  } while ((ulong)uVar1 * 0x30 != lVar14);
LAB_001230b6:
  *channels = builtinextras;
  *num_chans = (int16_t)uVar1;
  return 0;
}

Assistant:

OPENEXR_CORE_INTERNAL_NAMESPACE_SOURCE_ENTER

exr_result_t
internal_coding_fill_channel_info (
    exr_coding_channel_info_t**         channels,
    int16_t*                            num_chans,
    exr_coding_channel_info_t*          builtinextras,
    const exr_chunk_info_t*             cinfo,
    const struct _internal_exr_context* pctxt,
    const struct _internal_exr_part*    part)
{
    int                        chans;
    exr_attr_chlist_t*         chanlist;
    exr_coding_channel_info_t* chanfill;

    chanlist = part->channels->chlist;
    chans    = chanlist->num_channels;
    if (chans <= 5) { chanfill = builtinextras; }
    else
    {
        chanfill = (exr_coding_channel_info_t*) pctxt->alloc_fn (
            (size_t) (chans) * sizeof (exr_coding_channel_info_t));
        if (chanfill == NULL)
            return pctxt->standard_error (pctxt, EXR_ERR_OUT_OF_MEMORY);
        memset (
            chanfill, 0, (size_t) (chans) * sizeof (exr_coding_channel_info_t));
    }

    for (int c = 0; c < chans; ++c)
    {
        const exr_attr_chlist_entry_t* curc = (chanlist->entries + c);
        exr_coding_channel_info_t*     decc = (chanfill + c);

        decc->channel_name = curc->name.str;

        decc->height = compute_sampled_lines (
            cinfo->height, curc->y_sampling, cinfo->start_y);

        if (curc->x_sampling > 1)
            decc->width = cinfo->width / curc->x_sampling;
        else
            decc->width = cinfo->width;

        decc->x_samples         = curc->x_sampling;
        decc->y_samples         = curc->y_sampling;
        decc->p_linear          = curc->p_linear;
        decc->bytes_per_element = (curc->pixel_type == EXR_PIXEL_HALF) ? 2 : 4;
        decc->data_type         = (uint16_t) (curc->pixel_type);

        /* initialize these so they don't trip us up during decoding
         * when the user also chooses to skip a channel */
        decc->user_bytes_per_element = decc->bytes_per_element;
        decc->user_data_type         = decc->data_type;
        /* but leave the rest as zero for the user to fill in */
    }

    *channels  = chanfill;
    *num_chans = (int16_t) chans;

    return EXR_ERR_SUCCESS;
}